

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_destroy.c
# Opt level: O2

void linkedlist_destroy(s_linkedlist *linked_list,_func_void_void_ptr *fun_on_each)

{
  s_linkedlist_node *psVar1;
  s_linkedlist_node *__ptr;
  
  __ptr = linked_list->head;
  while (__ptr != (s_linkedlist_node *)0x0) {
    if ((fun_on_each != (_func_void_void_ptr *)0x0) && (__ptr->element != (void *)0x0)) {
      (*fun_on_each)(__ptr->element);
    }
    psVar1 = __ptr->next;
    free(__ptr);
    __ptr = psVar1;
  }
  free(linked_list);
  return;
}

Assistant:

void linkedlist_destroy(s_linkedlist *linked_list, void (*fun_on_each)(void *)) {
    s_linkedlist_node *current_entry = linked_list->head;
    s_linkedlist_node *to_delete     = NULL;

    while (current_entry != 0) {
        if (current_entry->element != NULL && fun_on_each != NULL) {
            fun_on_each(current_entry->element);
        }

        to_delete     = current_entry;
        current_entry = current_entry->next;

        free(to_delete);
    }

    free(linked_list);
}